

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wordset.cpp
# Opt level: O2

void __thiscall wordset::create_inserts(wordset *this,string *word)

{
  char cVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  string temp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  for (uVar5 = 0; lVar3 = DAT_00108198, lVar2 = (anonymous_namespace)::alphabet_abi_cxx11_,
      uVar5 < word->_M_string_length; uVar5 = uVar5 + 1) {
    for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
      cVar1 = *(char *)(lVar2 + lVar4);
      std::__cxx11::string::string((string *)&local_50,(string *)word);
      std::__cxx11::string::insert(&local_50,local_50._M_dataplus._M_p + uVar5,(int)cVar1);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->edits,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return;
}

Assistant:

void wordset::create_inserts(const string &word) {
    for (int i = 0; i < word.length(); ++i) {
        for (char c : alphabet) {
            string temp = word;
            temp.insert(temp.begin()+i, c);
            edits.insert(temp);
        }
    }
}